

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UBool icu_63::TimeZoneFormat::toCodePoints(UnicodeString *str,UChar32 *codeArray,int32_t size)

{
  int32_t iVar1;
  UChar32 UVar2;
  UBool UVar3;
  ulong uVar4;
  
  UVar3 = '\0';
  iVar1 = UnicodeString::countChar32(str,0,0x7fffffff);
  if ((iVar1 == size) && (UVar3 = '\x01', 0 < size)) {
    uVar4 = 0;
    iVar1 = 0;
    do {
      UVar2 = UnicodeString::char32At(str,iVar1);
      codeArray[uVar4] = UVar2;
      iVar1 = UnicodeString::moveIndex32(str,iVar1,1);
      uVar4 = uVar4 + 1;
    } while ((uint)size != uVar4);
  }
  return UVar3;
}

Assistant:

UBool
TimeZoneFormat::toCodePoints(const UnicodeString& str, UChar32* codeArray, int32_t size) {
    int32_t count = str.countChar32();
    if (count != size) {
        return FALSE;
    }

    for (int32_t idx = 0, start = 0; idx < size; idx++) {
        codeArray[idx] = str.char32At(start);
        start = str.moveIndex32(start, 1);
    }

    return TRUE;
}